

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O2

FILE * find_in_path(char *name,char *path,char **pfullname)

{
  char *pcVar1;
  size_t sVar2;
  FILE *pFVar3;
  char *__s;
  size_t __n;
  
  if (path != (char *)0x0) {
    while (__s = path, __s != (char *)0x0) {
      pcVar1 = strchr(__s,0x3a);
      if (pcVar1 == (char *)0x0) {
        __n = strlen(__s);
        path = (char *)0x0;
      }
      else {
        __n = (long)pcVar1 - (long)__s;
        path = pcVar1 + 1;
      }
      if (__n != 0) {
        sVar2 = strlen(name);
        pcVar1 = (char *)malloc(__n + sVar2 + 2);
        strncpy(pcVar1,__s,__n);
        (pcVar1 + __n)[0] = '/';
        (pcVar1 + __n)[1] = '\0';
        strcat(pcVar1,name);
        pFVar3 = fopen(pcVar1,"r");
        if (pFVar3 != (FILE *)0x0) {
          if (pfullname != (char **)0x0) {
            *pfullname = pcVar1;
            return (FILE *)pFVar3;
          }
          free(pcVar1);
          return (FILE *)pFVar3;
        }
        free(pcVar1);
      }
    }
  }
  return (FILE *)0x0;
}

Assistant:

FILE *find_in_path(const char *name, const char *path, char **pfullname) {
	if (!path)
		return 0;
	while (path) {
		const char *npath = strchr(path, ':');
		size_t plen;
		if (npath) {
			plen = npath - path;
			npath++;
		} else {
			plen = strlen(path);
		}
		if (plen) {
			char *fullname = malloc(strlen(name) + plen + 2);
			strncpy(fullname, path, plen);
			fullname[plen] = '/';
			fullname[plen+1] = 0;
			strcat(fullname, name);
			FILE *file = fopen(fullname, "r");
			if (file) {
				if (pfullname)
					*pfullname = fullname;
				else
					free(fullname);
				return file;
			}
			free(fullname);
		}
		path = npath;
	}
	return 0;
}